

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint64_t farmhash64_with_seeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  ulong uVar2;
  
  uVar1 = farmhash64_na(s,len);
  uVar2 = (uVar1 - seed0 ^ seed1) * -0x622015f714c7d297;
  uVar2 = (uVar2 >> 0x2f ^ seed1 ^ uVar2) * -0x622015f714c7d297;
  return (uVar2 ^ uVar2 >> 0x2f) * -0x622015f714c7d297;
}

Assistant:

uint64_t farmhash64_with_seeds(const char* s, size_t len, uint64_t seed0, uint64_t seed1) {
  return debug_tweak64(farmhash64_na_with_seeds(s, len, seed0, seed1));
}